

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie_swap.cpp
# Opt level: O2

int32_t utrie_swap_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                     UErrorCode *pErrorCode)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  int32_t iVar5;
  int32_t iVar6;
  void *pvVar7;
  
  iVar5 = 0;
  iVar6 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (iVar6 = iVar5, *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR))
  {
    if ((inData == (void *)0x0 || ds == (UDataSwapper *)0x0) ||
       (outData == (void *)0x0 && -1 < length)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else if ((uint)length < 0x10) {
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    }
    else {
      uVar1 = (*ds->readUInt32)(*inData);
      uVar2 = (*ds->readUInt32)(*(uint32_t *)((long)inData + 4));
      uVar3 = udata_readInt32_63(ds,*(int32_t *)((long)inData + 8));
      uVar4 = udata_readInt32_63(ds,*(int32_t *)((long)inData + 0xc));
      if (((((uVar2 & 0xf) == 5 && uVar1 == 0x54726965) &&
           (0x7ff < (int)uVar3 && (uVar2 & 0xf0) == 0x20)) && ((uVar3 & 0x1f) == 0)) &&
         (((0x1f < (int)uVar4 && ((uVar4 & 3) == 0)) && ((uVar4 < 0x120 & (byte)(uVar2 >> 9)) != 1))
         )) {
        iVar6 = (uVar4 << ((uVar2 >> 8 & 1) != 0) + 1) + uVar3 * 2 + 0x10;
        if (-1 < length) {
          if (length < iVar6) {
            *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            iVar6 = 0;
          }
          else {
            (*ds->swapArray32)(ds,inData,0x10,outData,pErrorCode);
            pvVar7 = (void *)((long)inData + 0x10);
            if ((uVar2 >> 8 & 1) == 0) {
              (*ds->swapArray16)(ds,pvVar7,(uVar4 + uVar3) * 2,(void *)((long)outData + 0x10),
                                 pErrorCode);
            }
            else {
              (*ds->swapArray16)(ds,pvVar7,uVar3 * 2,(void *)((long)outData + 0x10),pErrorCode);
              (*ds->swapArray32)(ds,(void *)((ulong)uVar3 * 2 + (long)pvVar7),uVar4 << 2,
                                 (void *)((long)outData + (ulong)uVar3 * 2 + 0x10),pErrorCode);
            }
          }
        }
      }
      else {
        *pErrorCode = U_INVALID_FORMAT_ERROR;
      }
    }
  }
  return iVar6;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie_swap(const UDataSwapper *ds,
           const void *inData, int32_t length, void *outData,
           UErrorCode *pErrorCode) {
    const UTrieHeader *inTrie;
    UTrieHeader trie;
    int32_t size;
    UBool dataIs32;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || (length>=0 && outData==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* setup and swapping */
    if(length>=0 && (uint32_t)length<sizeof(UTrieHeader)) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    inTrie=(const UTrieHeader *)inData;
    trie.signature=ds->readUInt32(inTrie->signature);
    trie.options=ds->readUInt32(inTrie->options);
    trie.indexLength=udata_readInt32(ds, inTrie->indexLength);
    trie.dataLength=udata_readInt32(ds, inTrie->dataLength);

    if( trie.signature!=0x54726965 ||
        (trie.options&UTRIE_OPTIONS_SHIFT_MASK)!=UTRIE_SHIFT ||
        ((trie.options>>UTRIE_OPTIONS_INDEX_SHIFT)&UTRIE_OPTIONS_SHIFT_MASK)!=UTRIE_INDEX_SHIFT ||
        trie.indexLength<UTRIE_BMP_INDEX_LENGTH ||
        (trie.indexLength&(UTRIE_SURROGATE_BLOCK_COUNT-1))!=0 ||
        trie.dataLength<UTRIE_DATA_BLOCK_LENGTH ||
        (trie.dataLength&(UTRIE_DATA_GRANULARITY-1))!=0 ||
        ((trie.options&UTRIE_OPTIONS_LATIN1_IS_LINEAR)!=0 && trie.dataLength<(UTRIE_DATA_BLOCK_LENGTH+0x100))
    ) {
        *pErrorCode=U_INVALID_FORMAT_ERROR; /* not a UTrie */
        return 0;
    }

    dataIs32=(UBool)((trie.options&UTRIE_OPTIONS_DATA_IS_32_BIT)!=0);
    size=sizeof(UTrieHeader)+trie.indexLength*2+trie.dataLength*(dataIs32?4:2);

    if(length>=0) {
        UTrieHeader *outTrie;

        if(length<size) {
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }

        outTrie=(UTrieHeader *)outData;

        /* swap the header */
        ds->swapArray32(ds, inTrie, sizeof(UTrieHeader), outTrie, pErrorCode);

        /* swap the index and the data */
        if(dataIs32) {
            ds->swapArray16(ds, inTrie+1, trie.indexLength*2, outTrie+1, pErrorCode);
            ds->swapArray32(ds, (const uint16_t *)(inTrie+1)+trie.indexLength, trie.dataLength*4,
                                     (uint16_t *)(outTrie+1)+trie.indexLength, pErrorCode);
        } else {
            ds->swapArray16(ds, inTrie+1, (trie.indexLength+trie.dataLength)*2, outTrie+1, pErrorCode);
        }
    }

    return size;
}